

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O0

void __thiscall
Assimp::PLYImporter::InternReadFile
          (PLYImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *this_00;
  aiMesh *paVar1;
  bool bVar2;
  int iVar3;
  IOStream *__p;
  pointer pIVar4;
  DeadlyImportError *pDVar5;
  undefined4 extraout_var;
  size_type sVar6;
  reference pvVar7;
  uchar *puVar8;
  aiMaterial **ppaVar9;
  reference ppaVar10;
  aiMesh **ppaVar11;
  aiNode *this_01;
  uint *puVar12;
  int __oflag;
  int __fd;
  vector<char,_std::allocator<char>_> *this_02;
  DOM *pDVar13;
  uint local_2e8;
  uint local_2e4;
  uint i_1;
  uint i;
  string defaultTexture;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> avMaterials;
  undefined1 local_2a0 [5];
  bool pointsOnly;
  undefined1 local_27a;
  allocator<char> local_279;
  string local_278;
  undefined1 local_252;
  allocator<char> local_251;
  string local_250;
  undefined1 local_22a;
  allocator<char> local_229;
  string local_228;
  undefined1 local_203;
  undefined1 local_202;
  allocator<char> local_201;
  undefined1 local_200 [5];
  bool bIsBE;
  undefined1 local_1e0 [8];
  DOM sPlyDom;
  char *szMe;
  vector<char,_std::allocator<char>_> mBuffer2;
  string local_188;
  undefined1 local_168 [8];
  vector<char,_std::allocator<char>_> headerCheck;
  IOStreamBuffer<char> streamedBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  long local_b8;
  size_t fileSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_68;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> fileStream;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string mode;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  PLYImporter *this_local;
  
  mode.field_2._8_8_ = pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"rb",&local_49);
  std::allocator<char>::~allocator(&local_49);
  __p = IOSystem::Open((IOSystem *)mode.field_2._8_8_,pFile,(string *)local_48);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_68,__p);
  pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_68)
  ;
  if (pIVar4 == (pointer)0x0) {
    fileSize._7_1_ = 1;
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open file ",pFile);
    std::operator+(&local_88,&local_a8,".");
    DeadlyImportError::DeadlyImportError(pDVar5,&local_88);
    fileSize._7_1_ = 0;
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_68);
  iVar3 = (*pIVar4->_vptr_IOStream[6])();
  local_b8 = CONCAT44(extraout_var,iVar3);
  if (local_b8 == 0) {
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_f8,"File ",pFile);
    std::operator+(&local_d8,&local_f8," is empty.");
    DeadlyImportError::DeadlyImportError(pDVar5,&local_d8);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  IOStreamBuffer<char>::IOStreamBuffer
            ((IOStreamBuffer<char> *)
             &headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             0x100000);
  pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_68)
  ;
  IOStreamBuffer<char>::open
            ((IOStreamBuffer<char> *)
             &headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             (char *)pIVar4,__oflag);
  this_02 = (vector<char,_std::allocator<char>_> *)local_168;
  std::vector<char,_std::allocator<char>_>::vector(this_02);
  IOStreamBuffer<char>::getNextLine
            ((IOStreamBuffer<char> *)
             &headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,this_02
            );
  iVar3 = (int)this_02;
  sVar6 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_168);
  if (sVar6 < 3) {
LAB_00753df2:
    IOStreamBuffer<char>::close
              ((IOStreamBuffer<char> *)
               &headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,iVar3
              );
    mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._22_1_ = 1;
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"Invalid .ply file: Magic number \'ply\' is no there",
               (allocator<char> *)
               &mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
    DeadlyImportError::DeadlyImportError(pDVar5,&local_188);
    mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._22_1_ = 0;
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_168,0);
  if (*pvVar7 != 'P') {
    iVar3 = 0;
    pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_168,0);
    if (*pvVar7 != 'p') goto LAB_00753df2;
  }
  pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_168,1);
  if (*pvVar7 != 'L') {
    iVar3 = 1;
    pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_168,1);
    if (*pvVar7 != 'l') goto LAB_00753df2;
  }
  pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_168,2);
  if (*pvVar7 != 'Y') {
    iVar3 = 2;
    pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_168,2);
    if (*pvVar7 != 'y') goto LAB_00753df2;
  }
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&szMe);
  IOStreamBuffer<char>::getNextLine
            ((IOStreamBuffer<char> *)
             &headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             (vector<char,_std::allocator<char>_> *)&szMe);
  puVar8 = (uchar *)std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)&szMe,0);
  this->mBuffer = puVar8;
  sPlyDom.alElementData.
  super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this->mBuffer;
  SkipSpacesAndLineEnd<char>
            ((char *)sPlyDom.alElementData.
                     super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (char **)&sPlyDom.alElementData.
                       super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  PLY::DOM::DOM((DOM *)local_1e0);
  this->pcDOM = (DOM *)local_1e0;
  iVar3 = 0xb512c8;
  bVar2 = TokenMatch<char>((char **)&sPlyDom.alElementData.
                                     super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,"format",6);
  if (!bVar2) {
    this->mBuffer = (uchar *)0x0;
    if (this->mGeneratedMesh != (aiMesh *)0x0) {
      paVar1 = this->mGeneratedMesh;
      if (paVar1 != (aiMesh *)0x0) {
        aiMesh::~aiMesh(paVar1);
        iVar3 = 0x520;
        operator_delete(paVar1,0x520);
      }
      this->mGeneratedMesh = (aiMesh *)0x0;
    }
    IOStreamBuffer<char>::close
              ((IOStreamBuffer<char> *)
               &headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,iVar3
              );
    local_27a = 1;
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"Invalid .ply file: Missing format specification",&local_279);
    DeadlyImportError::DeadlyImportError(pDVar5,&local_278);
    local_27a = 0;
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  bVar2 = TokenMatch<char>((char **)&sPlyDom.alElementData.
                                     super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,"ascii",5);
  if (bVar2) {
    SkipLine<char>((char *)sPlyDom.alElementData.
                           super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (char **)&sPlyDom.alElementData.
                             super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pDVar13 = (DOM *)local_1e0;
    bVar2 = PLY::DOM::ParseInstance
                      ((IOStreamBuffer<char> *)
                       &headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        field_0x10,pDVar13,this);
    iVar3 = (int)pDVar13;
    if (!bVar2) {
      if (this->mGeneratedMesh != (aiMesh *)0x0) {
        paVar1 = this->mGeneratedMesh;
        if (paVar1 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(paVar1);
          iVar3 = 0x520;
          operator_delete(paVar1,0x520);
        }
        this->mGeneratedMesh = (aiMesh *)0x0;
      }
      IOStreamBuffer<char>::close
                ((IOStreamBuffer<char> *)
                 &headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                 iVar3);
      local_202 = 1;
      pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,"Invalid .ply file: Unable to build DOM (#1)",&local_201);
      DeadlyImportError::DeadlyImportError(pDVar5,(string *)local_200);
      local_202 = 0;
      __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
  }
  else {
    __fd = 0xb7647e;
    iVar3 = strncmp((char *)sPlyDom.alElementData.
                            super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,"binary_",7);
    if (iVar3 != 0) {
      if (this->mGeneratedMesh != (aiMesh *)0x0) {
        paVar1 = this->mGeneratedMesh;
        if (paVar1 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(paVar1);
          __fd = 0x520;
          operator_delete(paVar1,0x520);
        }
        this->mGeneratedMesh = (aiMesh *)0x0;
      }
      IOStreamBuffer<char>::close
                ((IOStreamBuffer<char> *)
                 &headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                 __fd);
      local_252 = 1;
      pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"Invalid .ply file: Unknown file format",&local_251);
      DeadlyImportError::DeadlyImportError(pDVar5,&local_250);
      local_252 = 0;
      __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    sPlyDom.alElementData.
    super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&((sPlyDom.alElementData.
                            super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->alInstances).
                          super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                          ._M_impl.super__Vector_impl_data._M_start + 7);
    local_203 = isBigEndian((char *)sPlyDom.alElementData.
                                    super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pDVar13 = (DOM *)local_1e0;
    bVar2 = PLY::DOM::ParseInstanceBinary
                      ((IOStreamBuffer<char> *)
                       &headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        field_0x10,pDVar13,this,(bool)local_203);
    iVar3 = (int)pDVar13;
    if (!bVar2) {
      if (this->mGeneratedMesh != (aiMesh *)0x0) {
        paVar1 = this->mGeneratedMesh;
        if (paVar1 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(paVar1);
          iVar3 = 0x520;
          operator_delete(paVar1,0x520);
        }
        this->mGeneratedMesh = (aiMesh *)0x0;
      }
      IOStreamBuffer<char>::close
                ((IOStreamBuffer<char> *)
                 &headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                 iVar3);
      local_22a = 1;
      pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"Invalid .ply file: Unable to build DOM (#2)",&local_229);
      DeadlyImportError::DeadlyImportError(pDVar5,&local_228);
      local_22a = 0;
      __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
  }
  IOStreamBuffer<char>::close
            ((IOStreamBuffer<char> *)
             &headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,iVar3);
  if (this->mGeneratedMesh != (aiMesh *)0x0) {
    avMaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_1_ =
         -(this->mGeneratedMesh->mFaces == (aiFace *)0x0) & 1;
    if (avMaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ != 0) {
      this->mGeneratedMesh->mPrimitiveTypes = 1;
    }
    this_00 = (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
              ((long)&defaultTexture.field_2 + 8);
    std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::vector(this_00);
    std::__cxx11::string::string((string *)&i_1);
    LoadMaterial(this,this_00,(string *)&i_1,
                 (bool)(avMaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1));
    sVar6 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                      ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                       ((long)&defaultTexture.field_2 + 8));
    pScene->mNumMaterials = (uint)sVar6;
    ppaVar9 = (aiMaterial **)operator_new__((ulong)pScene->mNumMaterials << 3);
    pScene->mMaterials = ppaVar9;
    for (local_2e4 = 0; local_2e4 < pScene->mNumMaterials; local_2e4 = local_2e4 + 1) {
      ppaVar10 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::operator[]
                           ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                            ((long)&defaultTexture.field_2 + 8),(ulong)local_2e4);
      pScene->mMaterials[local_2e4] = *ppaVar10;
    }
    pScene->mNumMeshes = 1;
    ppaVar11 = (aiMesh **)operator_new__((ulong)pScene->mNumMeshes << 3);
    pScene->mMeshes = ppaVar11;
    *pScene->mMeshes = this->mGeneratedMesh;
    this->mGeneratedMesh = (aiMesh *)0x0;
    this_01 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_01);
    pScene->mRootNode = this_01;
    pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
    puVar12 = (uint *)operator_new__((ulong)pScene->mNumMeshes << 2);
    pScene->mRootNode->mMeshes = puVar12;
    for (local_2e8 = 0; local_2e8 < pScene->mRootNode->mNumMeshes; local_2e8 = local_2e8 + 1) {
      pScene->mRootNode->mMeshes[local_2e8] = local_2e8;
    }
    std::__cxx11::string::~string((string *)&i_1);
    std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~vector
              ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
               ((long)&defaultTexture.field_2 + 8));
    PLY::DOM::~DOM((DOM *)local_1e0);
    std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&szMe);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_168);
    IOStreamBuffer<char>::~IOStreamBuffer
              ((IOStreamBuffer<char> *)
               &headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
              (&local_68);
    std::__cxx11::string::~string((string *)local_48);
    return;
  }
  avMaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2a0,"Invalid .ply file: Unable to extract mesh data ",
             (allocator<char> *)
             ((long)&avMaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  DeadlyImportError::DeadlyImportError(pDVar5,(string *)local_2a0);
  avMaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void PLYImporter::InternReadFile(const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    const std::string mode = "rb";
    std::unique_ptr<IOStream> fileStream(pIOHandler->Open(pFile, mode));
    if (!fileStream.get()) {
        throw DeadlyImportError("Failed to open file " + pFile + ".");
    }

    // Get the file-size
    const size_t fileSize( fileStream->FileSize() );
    if ( 0 == fileSize ) {
        throw DeadlyImportError("File " + pFile + " is empty.");
    }

    IOStreamBuffer<char> streamedBuffer(1024 * 1024);
    streamedBuffer.open(fileStream.get());

    // the beginning of the file must be PLY - magic, magic
    std::vector<char> headerCheck;
    streamedBuffer.getNextLine(headerCheck);

    if ((headerCheck.size() < 3) ||
            (headerCheck[0] != 'P' && headerCheck[0] != 'p') ||
            (headerCheck[1] != 'L' && headerCheck[1] != 'l') ||
            (headerCheck[2] != 'Y' && headerCheck[2] != 'y') ) {
        streamedBuffer.close();
        throw DeadlyImportError("Invalid .ply file: Magic number \'ply\' is no there");
    }

    std::vector<char> mBuffer2;
    streamedBuffer.getNextLine(mBuffer2);
    mBuffer = (unsigned char*)&mBuffer2[0];

    char* szMe = (char*)&this->mBuffer[0];
    SkipSpacesAndLineEnd(szMe, (const char**)&szMe);

    // determine the format of the file data and construct the aiMesh
    PLY::DOM sPlyDom;   
    this->pcDOM = &sPlyDom;

    if (TokenMatch(szMe, "format", 6)) {
        if (TokenMatch(szMe, "ascii", 5)) {
            SkipLine(szMe, (const char**)&szMe);
            if (!PLY::DOM::ParseInstance(streamedBuffer, &sPlyDom, this)) {
                if (mGeneratedMesh != nullptr) {
                    delete(mGeneratedMesh);
                    mGeneratedMesh = nullptr;
                }

                streamedBuffer.close();
                throw DeadlyImportError("Invalid .ply file: Unable to build DOM (#1)");
            }
        } else if (!::strncmp(szMe, "binary_", 7)) {
            szMe += 7;
            const bool bIsBE(isBigEndian(szMe));

            // skip the line, parse the rest of the header and build the DOM
            if (!PLY::DOM::ParseInstanceBinary(streamedBuffer, &sPlyDom, this, bIsBE)) {
                if (mGeneratedMesh != nullptr) {
                    delete(mGeneratedMesh);
                    mGeneratedMesh = nullptr;
                }

                streamedBuffer.close();
                throw DeadlyImportError("Invalid .ply file: Unable to build DOM (#2)");
            }
        } else {
            if (mGeneratedMesh != nullptr) {
                delete(mGeneratedMesh);
                mGeneratedMesh = nullptr;
            }

            streamedBuffer.close();
            throw DeadlyImportError("Invalid .ply file: Unknown file format");
        }
    } else {
        AI_DEBUG_INVALIDATE_PTR(this->mBuffer);
        if (mGeneratedMesh != nullptr) {
            delete(mGeneratedMesh);
            mGeneratedMesh = nullptr;
        }

        streamedBuffer.close();
        throw DeadlyImportError("Invalid .ply file: Missing format specification");
    }

    //free the file buffer
    streamedBuffer.close();

    if (mGeneratedMesh == nullptr) {
        throw DeadlyImportError("Invalid .ply file: Unable to extract mesh data ");
    }

    // if no face list is existing we assume that the vertex
    // list is containing a list of points
    bool pointsOnly = mGeneratedMesh->mFaces == nullptr ? true : false;
    if (pointsOnly) {
      mGeneratedMesh->mPrimitiveTypes = aiPrimitiveType::aiPrimitiveType_POINT;
    }

    // now load a list of all materials
    std::vector<aiMaterial*> avMaterials;
    std::string defaultTexture;
    LoadMaterial(&avMaterials, defaultTexture, pointsOnly);

    // now generate the output scene object. Fill the material list
    pScene->mNumMaterials = (unsigned int)avMaterials.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    for (unsigned int i = 0; i < pScene->mNumMaterials; ++i) {
        pScene->mMaterials[i] = avMaterials[i];
    }

    // fill the mesh list
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    pScene->mMeshes[0] = mGeneratedMesh;
    mGeneratedMesh = nullptr;

    // generate a simple node structure
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
    pScene->mRootNode->mMeshes = new unsigned int[pScene->mNumMeshes];

    for (unsigned int i = 0; i < pScene->mRootNode->mNumMeshes; ++i) {
        pScene->mRootNode->mMeshes[i] = i;
    }
}